

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

vec3 __thiscall polyscope::SlicePlane::getNormal(SlicePlane *this)

{
  vec3 vVar1;
  bool *pbVar2;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar3;
  col_type *pcVar4;
  float *pfVar5;
  long in_RDI;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this_00;
  undefined1 auVar6 [64];
  vec<3,_float,_(glm::qualifier)0> vVar8;
  vec3 normal;
  float _x;
  float _y;
  vec<3,_float,_(glm::qualifier)0> local_c;
  undefined1 auVar7 [56];
  
  pbVar2 = PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x40));
  if ((*pbVar2 & 1U) == 0) {
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,-1.0,0.0,0.0);
  }
  else {
    this_00 = (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)(in_RDI + 0xb8);
    pmVar3 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get(this_00);
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar3,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    _x = *pfVar5;
    pmVar3 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get(this_00);
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar3,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,1);
    _y = *pfVar5;
    pmVar3 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get(this_00);
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar3,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,2);
    auVar7 = (undefined1  [56])0x0;
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_c,_x,_y,*pfVar5);
    vVar8 = glm::normalize<3,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)CONCAT44(_y,_x));
    local_c.field_2 = vVar8.field_2;
    auVar6._0_8_ = vVar8._0_8_;
    auVar6._8_56_ = auVar7;
    local_c._0_8_ = vmovlpd_avx(auVar6._0_16_);
  }
  vVar1.field_2 = local_c.field_2;
  vVar1.field_0 = local_c.field_0;
  vVar1.field_1 = local_c.field_1;
  return vVar1;
}

Assistant:

glm::vec3 SlicePlane::getNormal() {
  if (active.get()) {
    glm::vec3 normal{objectTransform.get()[0][0], objectTransform.get()[0][1], objectTransform.get()[0][2]};
    normal = glm::normalize(normal);
    return normal;
  } else {
    // Matched with center so tests always pass when disabled
    return glm::vec3{-1., 0., 0.};
  }
}